

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pStateChangeCallTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Performance::StateChangeCallTests::init(StateChangeCallTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  StateChangeCallTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_enable::StateChangeCallTest_enable(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"enable","Test cost of glEnable() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_disable::StateChangeCallTest_disable(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"disable","Test cost of glDisable() calls"
            );
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_depth_func::StateChangeCallTest_depth_func(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"depth_func",
             "Test cost of glDepthFunc() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_depth_mask::StateChangeCallTest_depth_mask(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"depth_mask",
             "Test cost of glDepthMask() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_stencil_mask::StateChangeCallTest_stencil_mask(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"stencil_mask",
             "Test cost of glStencilMask() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_clear_depth::StateChangeCallTest_clear_depth(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"clear_depth",
             "Test cost of glClearDepth() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_clear_stencil::StateChangeCallTest_clear_stencil(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"clear_stencil",
             "Test cost of glClearStencil() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_line_width::StateChangeCallTest_line_width(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"line_width",
             "Test cost of glLineWidth() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_cull_face::StateChangeCallTest_cull_face(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"cull_face",
             "Test cost of glCullFace() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_front_face::StateChangeCallTest_front_face(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"front_face",
             "Test cost of glFrontFace() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_blend_equation::StateChangeCallTest_blend_equation(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"blend_equation",
             "Test cost of glBlendEquation() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_enable_vertex_attrib_array::
  StateChangeCallTest_enable_vertex_attrib_array(deqp::gles2::Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"enable_vertex_attrib_array",
             "Test cost of glEnableVertexAttribArray() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_disable_vertex_attrib_array::
  StateChangeCallTest_disable_vertex_attrib_array(deqp::gles2::Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"disable_vertex_attrib_array",
             "Test cost of glDisableVertexAttribArray() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_use_program::StateChangeCallTest_use_program(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"use_program",
             "Test cost of glUseProgram() calls. Note: Uses only program 0.");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_active_texture::StateChangeCallTest_active_texture(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"active_texture",
             "Test cost of glActiveTexture() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_depth_range::StateChangeCallTest_depth_range(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"depth_range",
             "Test cost of glDepthRangef() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_polygon_offset::StateChangeCallTest_polygon_offset(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"polygon_offset",
             "Test cost of glPolygonOffset() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_sample_coverage::StateChangeCallTest_sample_coverage(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"sample_coverage",
             "Test cost of glSampleCoverage() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_blend_func::StateChangeCallTest_blend_func(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"blend_func",
             "Test cost of glBlendFunc() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_blend_equation_separate::
  StateChangeCallTest_blend_equation_separate(deqp::gles2::Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"blend_equation_separate",
             "Test cost of glBlendEquationSeparate() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_stencil_mask_separate::StateChangeCallTest_stencil_mask_separate(deqp
  ::gles2::Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"stencil_mask_separate",
             "Test cost of glStencilMaskSeparate() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_bind_buffer::StateChangeCallTest_bind_buffer(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"bind_buffer",
             "Test cost of glBindBuffer() calls. Note: Uses only buffer 0");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_bind_texture::StateChangeCallTest_bind_texture(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"bind_texture",
             "Test cost of glBindTexture() calls. Note: Uses only texture 0");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_hint::StateChangeCallTest_hint(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"hint","Test cost of glHint() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_stencil_func::StateChangeCallTest_stencil_func(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"stencil_func",
             "Test cost of glStencilFunc() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_stencil_op::StateChangeCallTest_stencil_op(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"stencil_op",
             "Test cost of glStencilOp() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_viewport::StateChangeCallTest_viewport(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"viewport",
             "Test cost of glViewport() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_scissor::StateChangeCallTest_scissor(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"scissor","Test cost of glScissor() calls"
            );
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_stencil_func_separate::StateChangeCallTest_stencil_func_separate(deqp
  ::gles2::Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"stencil_func_separate",
             "Test cost of glStencilFuncSeparate() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_stencil_op_separatae::StateChangeCallTest_stencil_op_separatae(deqp::
  gles2::Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"stencil_op_separatae",
             "Test cost of glStencilOpSeparate() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_blend_func_separate::StateChangeCallTest_blend_func_separate(deqp::
  gles2::Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"blend_func_separate",
             "Test cost of glBlendFuncSeparate() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_color_mask::StateChangeCallTest_color_mask(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"color_mask",
             "Test cost of glColorMask() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_clear_color::StateChangeCallTest_clear_color(deqp::gles2::
  Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"clear_color",
             "Test cost of glClearColor() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  init()::StateChangeCallTest_vertex_attrib_pointer::StateChangeCallTest_vertex_attrib_pointer(deqp
  ::gles2::Context__char_const__char_const__
            (pTVar1,(this->super_TestCaseGroup).m_context,"vertex_attrib_pointer",
             "Test cost of glVertexAttribPointer() calls");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void StateChangeCallTests::init (void)
{
	ADD_ARG_CASE1(enable, "Test cost of glEnable() calls",
		enable,
		GLenum,
		ARG_LIST({
			GL_CULL_FACE,
			GL_POLYGON_OFFSET_FILL,
			GL_SAMPLE_ALPHA_TO_COVERAGE,
			GL_SAMPLE_COVERAGE,
			GL_SCISSOR_TEST,
			GL_STENCIL_TEST,
			GL_DEPTH_TEST,
			GL_BLEND,
			GL_DITHER
		})
	);

	ADD_ARG_CASE1(disable, "Test cost of glDisable() calls",
		disable,
		GLenum,
		ARG_LIST({
			GL_CULL_FACE,
			GL_POLYGON_OFFSET_FILL,
			GL_SAMPLE_ALPHA_TO_COVERAGE,
			GL_SAMPLE_COVERAGE,
			GL_SCISSOR_TEST,
			GL_STENCIL_TEST,
			GL_DEPTH_TEST,
			GL_BLEND,
			GL_DITHER
		})
	);

	ADD_ARG_CASE1(depth_func, "Test cost of glDepthFunc() calls",
		depthFunc,
		GLenum,
		ARG_LIST({
			GL_NEVER,
			GL_ALWAYS,
			GL_LESS,
			GL_LEQUAL,
			GL_EQUAL,
			GL_GREATER,
			GL_GEQUAL,
			GL_NOTEQUAL
		})
	);

	ADD_ARG_CASE1(depth_mask, "Test cost of glDepthMask() calls",
		depthMask,
		GLboolean,
		ARG_LIST({
			GL_TRUE,
			GL_FALSE
		})
	);

	ADD_ARG_CASE1(stencil_mask, "Test cost of glStencilMask() calls",
		stencilMask,
		GLboolean,
		ARG_LIST({
			GL_TRUE,
			GL_FALSE
		})
	);

	ADD_ARG_CASE1(clear_depth, "Test cost of glClearDepth() calls",
		clearDepthf,
		GLclampf,
		ARG_LIST({
			0.0f,
			0.5f,
			1.0f
		})
	);

	ADD_ARG_CASE1(clear_stencil, "Test cost of glClearStencil() calls",
		clearStencil,
		GLint,
		ARG_LIST({
			0,
			128,
			28
		})
	);

	ADD_ARG_CASE1(line_width, "Test cost of glLineWidth() calls",
		lineWidth,
		GLfloat,
		ARG_LIST({
			1.0f,
			0.5f,
			10.0f
		})
	);

	ADD_ARG_CASE1(cull_face, "Test cost of glCullFace() calls",
		cullFace,
		GLenum,
		ARG_LIST({
			GL_FRONT,
			GL_BACK,
			GL_FRONT_AND_BACK
		})
	);

	ADD_ARG_CASE1(front_face, "Test cost of glFrontFace() calls",
		frontFace,
		GLenum,
		ARG_LIST({
			GL_CCW,
			GL_CW
		})
	);

	ADD_ARG_CASE1(blend_equation, "Test cost of glBlendEquation() calls",
		blendEquation,
		GLenum,
		ARG_LIST({
			GL_FUNC_ADD,
			GL_FUNC_SUBTRACT,
			GL_FUNC_REVERSE_SUBTRACT
		})
	);

	ADD_ARG_CASE1(enable_vertex_attrib_array, "Test cost of glEnableVertexAttribArray() calls",
		enableVertexAttribArray,
		GLuint,
		ARG_LIST({
			0,
			1,
			2,
			3,
			4,
			5,
			6,
			7,
		})
	);

	ADD_ARG_CASE1(disable_vertex_attrib_array, "Test cost of glDisableVertexAttribArray() calls",
		disableVertexAttribArray,
		GLuint,
		ARG_LIST({
			0,
			1,
			2,
			3,
			4,
			5,
			6,
			7,
		})
	);

	ADD_ARG_CASE1(use_program, "Test cost of glUseProgram() calls. Note: Uses only program 0.",
		useProgram,
		GLuint,
		ARG_LIST({
			0,
		})
	);

	ADD_ARG_CASE1(active_texture, "Test cost of glActiveTexture() calls",
		activeTexture,
		GLenum,
		ARG_LIST({
			GL_TEXTURE0,
			GL_TEXTURE1,
			GL_TEXTURE2,
			GL_TEXTURE3,
			GL_TEXTURE4,
			GL_TEXTURE5,
			GL_TEXTURE6,
			GL_TEXTURE7
		})
	);

	ADD_ARG_CASE2(depth_range, "Test cost of glDepthRangef() calls",
		depthRangef,
		GLclampf,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f
		}),
		GLclampf,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f
		})
	);

	ADD_ARG_CASE2(polygon_offset, "Test cost of glPolygonOffset() calls",
		polygonOffset,
		GLfloat,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f,
			10.0f
		}),
		GLfloat,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f,
			1000.0f
		})
	);

	ADD_ARG_CASE2(sample_coverage, "Test cost of glSampleCoverage() calls",
		sampleCoverage,
		GLclampf,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f,
			0.67f
		}),
		GLboolean,
		ARG_LIST({
			GL_TRUE,
			GL_FALSE
		})
	);

	ADD_ARG_CASE2(blend_func, "Test cost of glBlendFunc() calls",
		blendFunc,
		GLenum,
		ARG_LIST({
			GL_ZERO,
			GL_ONE,
			GL_SRC_COLOR,
			GL_ONE_MINUS_SRC_COLOR,
			GL_DST_COLOR,
			GL_ONE_MINUS_DST_COLOR,
			GL_SRC_ALPHA,
			GL_ONE_MINUS_SRC_ALPHA,
			GL_DST_ALPHA,
			GL_ONE_MINUS_DST_ALPHA,
			GL_CONSTANT_COLOR,
			GL_ONE_MINUS_CONSTANT_COLOR,
			GL_CONSTANT_ALPHA,
			GL_ONE_MINUS_CONSTANT_ALPHA
		}),
		GLenum,
		ARG_LIST({
			GL_ZERO,
			GL_ONE,
			GL_SRC_COLOR,
			GL_ONE_MINUS_SRC_COLOR,
			GL_DST_COLOR,
			GL_ONE_MINUS_DST_COLOR,
			GL_SRC_ALPHA,
			GL_ONE_MINUS_SRC_ALPHA,
			GL_DST_ALPHA,
			GL_ONE_MINUS_DST_ALPHA,
			GL_CONSTANT_COLOR,
			GL_ONE_MINUS_CONSTANT_COLOR,
			GL_CONSTANT_ALPHA,
			GL_ONE_MINUS_CONSTANT_ALPHA
		})
	);

	ADD_ARG_CASE2(blend_equation_separate, "Test cost of glBlendEquationSeparate() calls",
		blendEquationSeparate,
		GLenum,
		ARG_LIST({
			GL_FUNC_ADD,
			GL_FUNC_SUBTRACT,
			GL_FUNC_REVERSE_SUBTRACT
		}),
		GLenum,
		ARG_LIST({
			GL_FUNC_ADD,
			GL_FUNC_SUBTRACT,
			GL_FUNC_REVERSE_SUBTRACT
		})
	);

	ADD_ARG_CASE2(stencil_mask_separate, "Test cost of glStencilMaskSeparate() calls",
		stencilMaskSeparate,
		GLenum,
		ARG_LIST({
			GL_FRONT,
			GL_BACK,
			GL_FRONT_AND_BACK
		}),
		GLboolean,
		ARG_LIST({
			GL_TRUE,
			GL_FALSE
		})
	);

	ADD_ARG_CASE2(bind_buffer, "Test cost of glBindBuffer() calls. Note: Uses only buffer 0",
		bindBuffer,
		GLenum,
		ARG_LIST({
			GL_ELEMENT_ARRAY_BUFFER,
			GL_ARRAY_BUFFER
		}),
		GLuint,
		ARG_LIST({
			0
		})
	);

	ADD_ARG_CASE2(bind_texture, "Test cost of glBindTexture() calls. Note: Uses only texture 0",
		bindTexture,
		GLenum,
		ARG_LIST({
			GL_TEXTURE_2D,
			GL_TEXTURE_CUBE_MAP
		}),
		GLuint,
		ARG_LIST({
			0
		})
	);

	ADD_ARG_CASE2(hint, "Test cost of glHint() calls",
		hint,
		GLenum,
		ARG_LIST({
			GL_GENERATE_MIPMAP_HINT
		}),
		GLenum,
		ARG_LIST({
			GL_FASTEST,
			GL_NICEST,
			GL_DONT_CARE
		})
	);

	ADD_ARG_CASE3(stencil_func, "Test cost of glStencilFunc() calls",
		stencilFunc,
		GLenum,
		ARG_LIST({
			GL_NEVER,
			GL_ALWAYS,
			GL_LESS,
			GL_LEQUAL,
			GL_EQUAL,
			GL_GEQUAL,
			GL_GREATER,
			GL_NOTEQUAL
		}),
		GLint,
		ARG_LIST({
			0,
			1,
			255,
			128,
			7
		}),
		GLuint,
		ARG_LIST({
			0,
			1,
			255,
			128,
			7,
			0xFFFFFFFF
		})
	);

	ADD_ARG_CASE3(stencil_op, "Test cost of glStencilOp() calls",
		stencilOp,
		GLenum,
		ARG_LIST({
			GL_KEEP,
			GL_ZERO,
			GL_REPLACE,
			GL_INCR,
			GL_DECR,
			GL_INVERT,
			GL_INCR_WRAP,
			GL_DECR_WRAP
		}),
		GLenum,
		ARG_LIST({
			GL_KEEP,
			GL_ZERO,
			GL_REPLACE,
			GL_INCR,
			GL_DECR,
			GL_INVERT,
			GL_INCR_WRAP,
			GL_DECR_WRAP
		}),
		GLenum,
		ARG_LIST({
			GL_KEEP,
			GL_ZERO,
			GL_REPLACE,
			GL_INCR,
			GL_DECR,
			GL_INVERT,
			GL_INCR_WRAP,
			GL_DECR_WRAP
		})
	);

	ADD_ARG_CASE4(viewport, "Test cost of glViewport() calls",
		viewport,
		GLint,
		ARG_LIST({
			0,
			1,
			100,
			1145235
		}),
		GLint,
		ARG_LIST({
			0,
			1,
			100,
			1145235
		}),
		GLint,
		ARG_LIST({
			0,
			1,
			100,
			1145235
		}),
		GLint,
		ARG_LIST({
			0,
			1,
			100,
			1145235
		})
	);

	ADD_ARG_CASE4(scissor, "Test cost of glScissor() calls",
		scissor,
		GLint,
		ARG_LIST({
			0,
			1,
			100,
			1145235
		}),
		GLint,
		ARG_LIST({
			0,
			1,
			100,
			1145235
		}),
		GLint,
		ARG_LIST({
			0,
			1,
			100,
			1145235
		}),
		GLint,
		ARG_LIST({
			0,
			1,
			100,
			1145235
		})
	);

	ADD_ARG_CASE4(stencil_func_separate, "Test cost of glStencilFuncSeparate() calls",
		stencilFuncSeparate,
		GLenum,
		ARG_LIST({
			GL_FRONT,
			GL_BACK,
			GL_FRONT_AND_BACK
		}),
		GLenum,
		ARG_LIST({
			GL_NEVER,
			GL_ALWAYS,
			GL_LESS,
			GL_LEQUAL,
			GL_EQUAL,
			GL_GEQUAL,
			GL_GREATER,
			GL_NOTEQUAL
		}),
		GLint,
		ARG_LIST({
			0,
			1,
			255,
			128,
			7
		}),
		GLuint,
		ARG_LIST({
			0,
			1,
			255,
			128,
			7,
			0xFFFFFFFF
		})
	);

	ADD_ARG_CASE4(stencil_op_separatae, "Test cost of glStencilOpSeparate() calls",
		stencilOpSeparate,
		GLenum,
		ARG_LIST({
			GL_FRONT,
			GL_BACK,
			GL_FRONT_AND_BACK
		}),
		GLenum,
		ARG_LIST({
			GL_KEEP,
			GL_ZERO,
			GL_REPLACE,
			GL_INCR,
			GL_DECR,
			GL_INVERT,
			GL_INCR_WRAP,
			GL_DECR_WRAP
		}),
		GLenum,
		ARG_LIST({
			GL_KEEP,
			GL_ZERO,
			GL_REPLACE,
			GL_INCR,
			GL_DECR,
			GL_INVERT,
			GL_INCR_WRAP,
			GL_DECR_WRAP
		}),
		GLenum,
		ARG_LIST({
			GL_KEEP,
			GL_ZERO,
			GL_REPLACE,
			GL_INCR,
			GL_DECR,
			GL_INVERT,
			GL_INCR_WRAP,
			GL_DECR_WRAP
		})
	);

	ADD_ARG_CASE4(blend_func_separate, "Test cost of glBlendFuncSeparate() calls",
		blendFuncSeparate,
		GLenum,
		ARG_LIST({
			GL_ZERO,
			GL_ONE,
			GL_SRC_COLOR,
			GL_ONE_MINUS_SRC_COLOR,
			GL_DST_COLOR,
			GL_ONE_MINUS_DST_COLOR,
			GL_SRC_ALPHA,
			GL_ONE_MINUS_SRC_ALPHA,
			GL_DST_ALPHA,
			GL_ONE_MINUS_DST_ALPHA,
			GL_CONSTANT_COLOR,
			GL_ONE_MINUS_CONSTANT_COLOR,
			GL_CONSTANT_ALPHA,
			GL_ONE_MINUS_CONSTANT_ALPHA
		}),
		GLenum,
		ARG_LIST({
			GL_ZERO,
			GL_ONE,
			GL_SRC_COLOR,
			GL_ONE_MINUS_SRC_COLOR,
			GL_DST_COLOR,
			GL_ONE_MINUS_DST_COLOR,
			GL_SRC_ALPHA,
			GL_ONE_MINUS_SRC_ALPHA,
			GL_DST_ALPHA,
			GL_ONE_MINUS_DST_ALPHA,
			GL_CONSTANT_COLOR,
			GL_ONE_MINUS_CONSTANT_COLOR,
			GL_CONSTANT_ALPHA,
			GL_ONE_MINUS_CONSTANT_ALPHA
		}),
		GLenum,
		ARG_LIST({
			GL_ZERO,
			GL_ONE,
			GL_SRC_COLOR,
			GL_ONE_MINUS_SRC_COLOR,
			GL_DST_COLOR,
			GL_ONE_MINUS_DST_COLOR,
			GL_SRC_ALPHA,
			GL_ONE_MINUS_SRC_ALPHA,
			GL_DST_ALPHA,
			GL_ONE_MINUS_DST_ALPHA,
			GL_CONSTANT_COLOR,
			GL_ONE_MINUS_CONSTANT_COLOR,
			GL_CONSTANT_ALPHA,
			GL_ONE_MINUS_CONSTANT_ALPHA
		}),
		GLenum,
		ARG_LIST({
			GL_ZERO,
			GL_ONE,
			GL_SRC_COLOR,
			GL_ONE_MINUS_SRC_COLOR,
			GL_DST_COLOR,
			GL_ONE_MINUS_DST_COLOR,
			GL_SRC_ALPHA,
			GL_ONE_MINUS_SRC_ALPHA,
			GL_DST_ALPHA,
			GL_ONE_MINUS_DST_ALPHA,
			GL_CONSTANT_COLOR,
			GL_ONE_MINUS_CONSTANT_COLOR,
			GL_CONSTANT_ALPHA,
			GL_ONE_MINUS_CONSTANT_ALPHA
		})
	);

	ADD_ARG_CASE4(color_mask, "Test cost of glColorMask() calls",
		colorMask,
		GLboolean,
		ARG_LIST({
			GL_TRUE,
			GL_FALSE
		}),
		GLboolean,
		ARG_LIST({
			GL_TRUE,
			GL_FALSE
		}),
		GLboolean,
		ARG_LIST({
			GL_TRUE,
			GL_FALSE
		}),
		GLboolean,
		ARG_LIST({
			GL_TRUE,
			GL_FALSE
		})
	);

	ADD_ARG_CASE4(clear_color, "Test cost of glClearColor() calls",
		clearColor,
		GLclampf,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f,
			0.33f
		}),
		GLclampf,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f,
			0.33f
		}),
		GLclampf,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f,
			0.33f
		}),
		GLclampf,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f,
			0.33f
		})
	);

	ADD_ARG_CASE6(vertex_attrib_pointer, "Test cost of glVertexAttribPointer() calls",
		vertexAttribPointer,
		GLuint,
		ARG_LIST({
			0,
			1,
			2,
			3,
			4,
			5,
			6,
			7
		}),
		GLint,
		ARG_LIST({
			1,
			2,
			3,
			4
		}),
		GLenum,
		ARG_LIST({
			GL_UNSIGNED_BYTE,
			GL_BYTE,
			GL_UNSIGNED_SHORT,
			GL_SHORT,
			GL_FLOAT
		}),
		GLboolean,
		ARG_LIST({
			GL_FALSE,
			GL_TRUE
		}),
		GLsizei,
		ARG_LIST({
			0,
			2,
			4
		}),
		void*,
		ARG_LIST({
			(void*)(deUintptr)(0x0FF),
			(void*)(deUintptr)(0x0EF)
		})
	);
}